

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetisWriter.cc
# Opt level: O1

void writeMetisLine(ofstream *outputfile,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *neighbors)

{
  ostream_type *poVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ostream_type *poVar5;
  pointer __value;
  ostream_type *poVar6;
  string untrimmed_neighbor_str;
  stringstream node_list_stream;
  allocator local_1f1;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_1f0;
  ostream_type local_1e0 [16];
  char *local_1d0;
  char local_1c0 [16];
  stringstream local_1b0 [16];
  ostream_type local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  __value = (neighbors->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1f0._M_stream = local_1a0;
  local_1f0._M_string = " ";
  lVar4 = (long)(neighbors->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)__value >> 3;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                (&local_1f0,__value);
      __value = __value + 1;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1f0,local_1d0,&local_1f1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  poVar1 = local_1f0._M_stream;
  poVar6 = local_1f0._M_stream + (long)local_1f0._M_string;
  poVar5 = poVar6;
  if (0 < (long)local_1f0._M_string >> 2) {
    poVar5 = local_1f0._M_stream + ((uint)local_1f0._M_string & 3);
    lVar4 = ((long)local_1f0._M_string >> 2) + 1;
    do {
      iVar2 = isspace((int)(char)poVar6[-1]);
      if (iVar2 == 0) goto LAB_0010dafc;
      iVar2 = isspace((int)(char)poVar6[-2]);
      if (iVar2 == 0) {
        poVar6 = poVar6 + -1;
        goto LAB_0010dafc;
      }
      iVar2 = isspace((int)(char)poVar6[-3]);
      if (iVar2 == 0) {
        poVar6 = poVar6 + -2;
        goto LAB_0010dafc;
      }
      iVar2 = isspace((int)(char)poVar6[-4]);
      if (iVar2 == 0) {
        poVar6 = poVar6 + -3;
        goto LAB_0010dafc;
      }
      poVar6 = poVar6 + -4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)poVar5 - (long)poVar1;
  if (lVar4 != 1) {
    poVar6 = poVar5;
    if (lVar4 != 2) {
      poVar6 = poVar1;
      if ((lVar4 != 3) || (iVar2 = isspace((int)(char)poVar5[-1]), poVar6 = poVar5, iVar2 == 0))
      goto LAB_0010dafc;
      poVar6 = poVar5 + -1;
    }
    iVar2 = isspace((int)(char)poVar6[-1]);
    if (iVar2 == 0) goto LAB_0010dafc;
    poVar5 = poVar6 + -1;
  }
  iVar2 = isspace((int)(char)poVar5[-1]);
  poVar6 = poVar5;
  if (iVar2 != 0) {
    poVar6 = poVar1;
  }
LAB_0010dafc:
  local_1f0._M_string = (char *)(poVar6 + -(long)poVar1);
  *poVar6 = (ostream_type)0x0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)outputfile,(char *)local_1f0._M_stream,(long)local_1f0._M_string);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1f0._M_stream != local_1e0) {
    operator_delete(local_1f0._M_stream);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void writeMetisLine(std::ofstream* outputfile,
            const std::vector<uint64_t>& neighbors) {
        std::stringstream node_list_stream;
        std::copy(neighbors.begin(),
                neighbors.end(),
                std::ostream_iterator<uint64_t>(node_list_stream, " "));
        std::string untrimmed_neighbor_str = node_list_stream.str().c_str();
        *outputfile << rtrim(&untrimmed_neighbor_str) << std::endl;
    }